

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

Arg * __thiscall fmt::ArgList::operator[](ArgList *this,uint index)

{
  Type TVar1;
  Type TVar2;
  Value *pVVar3;
  uint in_EDX;
  ArgList *in_RSI;
  Arg *in_RDI;
  uint i;
  Value *val;
  Type arg_type;
  bool use_values;
  Arg arg;
  Value *local_70;
  uint local_4c;
  LongLong local_38;
  size_t local_30;
  uint uStack_24;
  undefined8 local_20;
  
  TVar1 = type(in_RSI,0xf);
  if (in_EDX < 0x10) {
    TVar2 = type(in_RSI,in_EDX);
    if (TVar2 != NONE) {
      if (TVar1 != NONE) {
        local_70 = (in_RSI->field_1).values_ + (ulong)in_EDX * 2;
      }
      else {
        local_70 = (in_RSI->field_1).values_ + in_EDX;
      }
      local_38 = (local_70->field_0).long_long_value;
      local_30 = (local_70->field_0).string.size;
    }
    (in_RDI->super_Value).field_0.long_long_value = local_38;
    (in_RDI->super_Value).field_0.string.size = local_30;
    *(ulong *)&in_RDI->type = CONCAT44(uStack_24,TVar2);
    *(undefined8 *)&in_RDI->field_0x18 = local_20;
  }
  else if (TVar1 != NONE) {
    for (local_4c = 0x10; local_4c <= in_EDX; local_4c = local_4c + 1) {
      if ((in_RSI->field_1).values_[(ulong)local_4c * 2 + 1].field_0.int_value == 0) {
        pVVar3 = (in_RSI->field_1).values_ + (ulong)local_4c * 2;
        (in_RDI->super_Value).field_0.long_long_value = (pVVar3->field_0).long_long_value;
        (in_RDI->super_Value).field_0.string.size = (pVVar3->field_0).string.size;
        *(LongLong *)&in_RDI->type = pVVar3[1].field_0.long_long_value;
        *(size_t *)&in_RDI->field_0x18 = pVVar3[1].field_0.string.size;
        return in_RDI;
      }
    }
    pVVar3 = (in_RSI->field_1).values_ + (ulong)in_EDX * 2;
    (in_RDI->super_Value).field_0.long_long_value = (pVVar3->field_0).long_long_value;
    (in_RDI->super_Value).field_0.string.size = (pVVar3->field_0).string.size;
    *(LongLong *)&in_RDI->type = pVVar3[1].field_0.long_long_value;
    *(size_t *)&in_RDI->field_0x18 = pVVar3[1].field_0.string.size;
  }
  else {
    (in_RDI->super_Value).field_0.long_long_value = local_38;
    (in_RDI->super_Value).field_0.string.size = local_30;
    *(ulong *)&in_RDI->type = (ulong)uStack_24 << 0x20;
    *(undefined8 *)&in_RDI->field_0x18 = local_20;
  }
  return in_RDI;
}

Assistant:

internal::Arg operator[](unsigned index) const {
    using internal::Arg;
    Arg arg;
    bool use_values = type(MAX_PACKED_ARGS - 1) == Arg::NONE;
    if (index < MAX_PACKED_ARGS) {
      Arg::Type arg_type = type(index);
      internal::Value &val = arg;
      if (arg_type != Arg::NONE)
        val = use_values ? values_[index] : args_[index];
      arg.type = arg_type;
      return arg;
    }
    if (use_values) {
      // The index is greater than the number of arguments that can be stored
      // in values, so return a "none" argument.
      arg.type = Arg::NONE;
      return arg;
    }
    for (unsigned i = MAX_PACKED_ARGS; i <= index; ++i) {
      if (args_[i].type == Arg::NONE)
        return args_[i];
    }
    return args_[index];
  }